

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

int __thiscall
chaiscript::detail::Any::
Data_Impl<std::shared_ptr<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>_>
::clone(Data_Impl<std::shared_ptr<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>_>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _func_int **pp_Var2;
  __shared_ptr<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>,_(__gnu_cxx::_Lock_policy)2>
  local_28;
  
  pp_Var2 = (_func_int **)operator_new(0x20);
  std::
  __shared_ptr<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_28,
                 (__shared_ptr<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)(__fn + 0x10));
  _Var1._M_pi = local_28._M_refcount._M_pi;
  pp_Var2[1] = (_func_int *)
               &std::
                shared_ptr<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
                ::typeinfo;
  *pp_Var2 = (_func_int *)&PTR__Data_Impl_0031eb08;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pp_Var2[2] = (_func_int *)local_28._M_ptr;
  pp_Var2[3] = (_func_int *)_Var1._M_pi;
  local_28._M_ptr = (element_type *)0x0;
  (this->super_Data)._vptr_Data = pp_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return (int)this;
}

Assistant:

std::unique_ptr<Data> clone() const CHAISCRIPT_OVERRIDE
            {
              return std::unique_ptr<Data>(new Data_Impl<T>(m_data));
            }